

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginRegistry.cpp
# Opt level: O2

void Rml::PluginRegistry::UnregisterPlugin(Plugin *plugin)

{
  uint uVar1;
  PluginVectors *pPVar2;
  Plugin *value;
  Plugin *value_00;
  Plugin *value_01;
  
  uVar1 = (*plugin->_vptr_Plugin[2])();
  if ((uVar1 & 1) != 0) {
    pPVar2 = ControlledLifetimeResource<Rml::PluginVectors>::operator->
                       ((ControlledLifetimeResource<Rml::PluginVectors> *)plugin_vectors);
    UnregisterPlugin::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)pPVar2,(Vector<Plugin_*> *)plugin,value);
  }
  if ((uVar1 & 2) != 0) {
    pPVar2 = ControlledLifetimeResource<Rml::PluginVectors>::operator->
                       ((ControlledLifetimeResource<Rml::PluginVectors> *)plugin_vectors);
    UnregisterPlugin::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&pPVar2->document,(Vector<Plugin_*> *)plugin,value_00);
  }
  if ((uVar1 & 4) == 0) {
    return;
  }
  pPVar2 = ControlledLifetimeResource<Rml::PluginVectors>::operator->
                     ((ControlledLifetimeResource<Rml::PluginVectors> *)plugin_vectors);
  UnregisterPlugin::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&pPVar2->element,(Vector<Plugin_*> *)plugin,value_01);
  return;
}

Assistant:

void PluginRegistry::UnregisterPlugin(Plugin* plugin)
{
	auto erase_value = [](Vector<Plugin*>& container, Plugin* value) {
		container.erase(std::remove(container.begin(), container.end(), value), container.end());
	};

	int event_classes = plugin->GetEventClasses();
	if (event_classes & Plugin::EVT_BASIC)
		erase_value(plugin_vectors->basic, plugin);
	if (event_classes & Plugin::EVT_DOCUMENT)
		erase_value(plugin_vectors->document, plugin);
	if (event_classes & Plugin::EVT_ELEMENT)
		erase_value(plugin_vectors->element, plugin);
}